

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_common.c
# Opt level: O0

int dfft_create_plan_common
              (dfft_plan *p,int ndim,int *gdim,int *inembed,int *oembed,int *pdim,int *pidx,
              int row_m,int input_cyclic,int output_cyclic,MPI_Comm comm,int *proc_map,int device)

{
  int iVar1;
  int dim;
  void *pvVar2;
  long in_RCX;
  int *in_RDX;
  int in_ESI;
  int *in_RDI;
  long in_R8;
  int *in_R9;
  long in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined8 in_stack_00000028;
  int scratch_size;
  int length_2;
  int howmany;
  int st;
  int d;
  int dmax;
  int size;
  int res;
  int length_1;
  int c;
  int length;
  int size_out;
  int size_in;
  int i;
  int nump;
  int s;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_90;
  int local_78;
  int local_60;
  int local_54;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40 [2];
  int *local_38;
  int local_4;
  
  *(undefined8 *)(in_RDI + 0x1a) = in_stack_00000028;
  local_38 = in_R9;
  MPI_Comm_size(in_stack_00000028,local_40);
  if ((local_40[0] & local_40[0] - 1) == 0) {
    pvVar2 = malloc((long)(int)local_40[0] << 2);
    *(void **)(in_RDI + 0x48) = pvVar2;
    memcpy(*(void **)(in_RDI + 0x48),_scratch_size,(long)(int)local_40[0] << 2);
    pvVar2 = malloc((long)in_ESI << 2);
    *(void **)(in_RDI + 0x16) = pvVar2;
    pvVar2 = malloc((long)in_ESI << 2);
    *(void **)(in_RDI + 2) = pvVar2;
    pvVar2 = malloc((long)in_ESI << 2);
    *(void **)(in_RDI + 0x18) = pvVar2;
    pvVar2 = malloc((long)in_ESI << 2);
    *(void **)(in_RDI + 4) = pvVar2;
    pvVar2 = malloc((long)in_ESI << 2);
    *(void **)(in_RDI + 6) = pvVar2;
    *in_RDI = in_ESI;
    for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
      *(int *)(*(long *)(in_RDI + 2) + (long)local_44 * 4) = in_RDX[local_44];
      if ((in_RDX[local_44] & in_RDX[local_44] - 1U) != 0) {
        return 5;
      }
      *(int *)(*(long *)(in_RDI + 0x16) + (long)local_44 * 4) = local_38[local_44];
    }
    if (in_RCX == 0) {
      for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
        *(int *)(*(long *)(in_RDI + 4) + (long)local_44 * 4) =
             *(int *)(*(long *)(in_RDI + 2) + (long)local_44 * 4) /
             *(int *)(*(long *)(in_RDI + 0x16) + (long)local_44 * 4);
      }
    }
    else {
      for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
        *(undefined4 *)(*(long *)(in_RDI + 4) + (long)local_44 * 4) =
             *(undefined4 *)(in_RCX + (long)local_44 * 4);
      }
    }
    if (in_R8 == 0) {
      for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
        *(int *)(*(long *)(in_RDI + 6) + (long)local_44 * 4) =
             *(int *)(*(long *)(in_RDI + 2) + (long)local_44 * 4) /
             *(int *)(*(long *)(in_RDI + 0x16) + (long)local_44 * 4);
      }
    }
    else {
      for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
        *(undefined4 *)(*(long *)(in_RDI + 6) + (long)local_44 * 4) =
             *(undefined4 *)(in_R8 + (long)local_44 * 4);
      }
    }
    pvVar2 = malloc((long)(int)local_40[0] << 2);
    *(void **)(in_RDI + 0x1e) = pvVar2;
    pvVar2 = malloc((long)(int)local_40[0] << 2);
    *(void **)(in_RDI + 0x1c) = pvVar2;
    pvVar2 = malloc((long)(int)local_40[0] << 2);
    *(void **)(in_RDI + 0x22) = pvVar2;
    pvVar2 = malloc((long)(int)local_40[0] << 2);
    *(void **)(in_RDI + 0x20) = pvVar2;
    if (howmany == 0) {
      pvVar2 = malloc((long)in_ESI * 0x18);
      *(void **)(in_RDI + 8) = pvVar2;
      pvVar2 = malloc((long)in_ESI * 0x18);
      *(void **)(in_RDI + 10) = pvVar2;
      pvVar2 = malloc((long)in_ESI * 0x18);
      *(void **)(in_RDI + 0xc) = pvVar2;
      pvVar2 = malloc((long)in_ESI * 0x18);
      *(void **)(in_RDI + 0xe) = pvVar2;
    }
    local_48 = 1;
    local_4c = 1;
    **(int **)(in_RDI + 4) = *in_RDX / *local_38;
    **(int **)(in_RDI + 6) = *in_RDX / *local_38;
    for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
      local_48 = *(int *)(*(long *)(in_RDI + 4) + (long)local_44 * 4) * local_48;
      local_4c = *(int *)(*(long *)(in_RDI + 6) + (long)local_44 * 4) * local_4c;
    }
    in_RDI[0x2c] = local_48;
    in_RDI[0x2d] = local_4c;
    pvVar2 = malloc((long)in_ESI << 2);
    *(void **)(in_RDI + 0x2e) = pvVar2;
    for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
      iVar1 = in_RDX[local_44] / local_38[local_44];
      if (iVar1 < 2) {
        *(undefined4 *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4) = 1;
      }
      else {
        for (local_54 = in_RDX[local_44]; iVar1 < local_54; local_54 = local_54 / iVar1) {
        }
        *(int *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4) = local_54;
      }
    }
    pvVar2 = malloc((long)in_ESI << 3);
    *(void **)(in_RDI + 0x10) = pvVar2;
    pvVar2 = malloc((long)in_ESI << 3);
    *(void **)(in_RDI + 0x12) = pvVar2;
    pvVar2 = malloc((long)in_ESI << 3);
    *(void **)(in_RDI + 0x14) = pvVar2;
    for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
      iVar1 = in_RDX[local_44] / local_38[local_44];
      pvVar2 = malloc((long)iVar1 << 2);
      *(void **)(*(long *)(in_RDI + 0x10) + (long)local_44 * 8) = pvVar2;
      pvVar2 = malloc((ulong)((long)local_38[local_44] << 2) /
                      (ulong)(long)*(int *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4));
      *(void **)(*(long *)(in_RDI + 0x12) + (long)local_44 * 8) = pvVar2;
      pvVar2 = malloc((ulong)((long)iVar1 << 2) /
                      (ulong)(long)*(int *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4));
      *(void **)(*(long *)(in_RDI + 0x14) + (long)local_44 * 8) = pvVar2;
      bitrev_init(iVar1,*(int **)(*(long *)(in_RDI + 0x10) + (long)local_44 * 8));
      bitrev_init(local_38[local_44] / *(int *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4),
                  *(int **)(*(long *)(in_RDI + 0x12) + (long)local_44 * 8));
      bitrev_init(iVar1 / *(int *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4),
                  *(int **)(*(long *)(in_RDI + 0x14) + (long)local_44 * 8));
    }
    for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + (long)local_44 * 4) =
           *(undefined4 *)(in_stack_00000008 + (long)local_44 * 4);
    }
    if (howmany == 0) {
      iVar1 = dfft_init_local_fft();
      if (iVar1 == 0) {
        local_60 = local_48;
        in_RDI[0x38] = 0;
        in_RDI[0x32] = 0;
        for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
          iVar1 = (local_60 / *(int *)(*(long *)(in_RDI + 4) + (long)local_44 * 4)) *
                  (in_RDX[local_44] / local_38[local_44]);
          dfft_create_1d_plan((plan_t *)(*(long *)(in_RDI + 8) + (long)local_44 * 0x18),
                              *(int *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4),1,
                              iVar1 / *(int *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4),1,
                              iVar1 / *(int *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4),1,0);
          dfft_create_1d_plan((plan_t *)(*(long *)(in_RDI + 0xc) + (long)local_44 * 0x18),
                              *(int *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4),1,
                              iVar1 / *(int *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4),1,
                              iVar1 / *(int *)(*(long *)(in_RDI + 0x2e) + (long)local_44 * 4),1,1);
          dim = in_RDX[local_44] / local_38[local_44];
          dfft_create_1d_plan((plan_t *)(*(long *)(in_RDI + 10) + (long)local_44 * 0x18),dim,1,
                              iVar1 / dim,1,iVar1 / dim,1,0);
          in_stack_ffffffffffffff58 = 1;
          in_stack_ffffffffffffff60 = 1;
          dfft_create_1d_plan((plan_t *)(*(long *)(in_RDI + 0xe) + (long)local_44 * 0x18),dim,1,
                              iVar1 / dim,1,iVar1 / dim,1,1);
          local_60 = *(int *)(*(long *)(in_RDI + 6) + (long)local_44 * 4) *
                     (local_60 / *(int *)(*(long *)(in_RDI + 4) + (long)local_44 * 4));
        }
        local_78 = 1;
        for (local_44 = 0; local_44 < in_ESI; local_44 = local_44 + 1) {
          if (*(int *)(*(long *)(in_RDI + 6) + (long)local_44 * 4) <
              *(int *)(*(long *)(in_RDI + 4) + (long)local_44 * 4)) {
            local_90 = *(int *)(*(long *)(in_RDI + 4) + (long)local_44 * 4);
          }
          else {
            local_90 = *(int *)(*(long *)(in_RDI + 6) + (long)local_44 * 4);
          }
          local_78 = local_90 * local_78;
        }
        in_RDI[0x2a] = local_78;
        dfft_allocate_aligned_memory
                  ((cpx_t **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        dfft_allocate_aligned_memory
                  ((cpx_t **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        dfft_allocate_aligned_memory
                  ((cpx_t **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        in_RDI[0x30] = in_stack_00000018;
        in_RDI[0x31] = in_stack_00000020;
        in_RDI[0x33] = in_stack_00000010;
        in_RDI[0x4a] = 1;
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 2;
    }
  }
  else {
    local_4 = 4;
  }
  return local_4;
}

Assistant:

int dfft_create_plan_common(dfft_plan *p,
    int ndim, int *gdim,
    int *inembed, int *oembed,
    int *pdim, int *pidx, int row_m,
    int input_cyclic, int output_cyclic,
    MPI_Comm comm,
    int *proc_map,
    int device)
    {
    int s,nump;

    p->comm = comm;

    MPI_Comm_size(comm,&nump);

    /* number of processor must be power of two */
    if (nump & (nump-1)) return 4;

    /* Allocate memory for processor map and copy over */
    p->proc_map = malloc(sizeof(int)*nump);
    memcpy(p->proc_map, proc_map, sizeof(int)*nump);

    p->pdim = malloc(ndim*sizeof(int));
    p->gdim = malloc(ndim*sizeof(int));
    p->pidx = malloc(ndim*sizeof(int));

    p->inembed = malloc(ndim*sizeof(int));
    p->oembed = malloc(ndim*sizeof(int));

    p->ndim = ndim;

    int i;
    for (i = 0; i < ndim; i++)
        {
        p->gdim[i] = gdim[i];

        /* Every dimension must be a power of two */
        if (gdim[i] & (gdim[i]-1)) return 5;

        p->pdim[i] = pdim[i];
        }

    if (inembed != NULL)
        {
        for (i = 0; i < ndim; i++)
            p->inembed[i] = inembed[i];
        }
    else
        {
        for (i = 0; i < ndim; i++)
            p->inembed[i] = p->gdim[i]/p->pdim[i];
        }

    if (oembed != NULL)
        {
        for (i = 0; i < ndim; i++)
            p->oembed[i] = oembed[i];
        }
    else
        {
        for (i = 0; i < ndim; i++)
            p->oembed[i] = p->gdim[i]/p->pdim[i];
        }

    p->offset_send = (int *)malloc(sizeof(int)*nump);
    p->offset_recv = (int *)malloc(sizeof(int)*nump);
    p->nsend = (int *)malloc(sizeof(int)*nump);
    p->nrecv = (int *)malloc(sizeof(int)*nump);

    if (!device)
        {
        #ifdef ENABLE_HOST
        p->plans_short_forward = malloc(sizeof(plan_t)*ndim);
        p->plans_long_forward = malloc(sizeof(plan_t)*ndim);
        p->plans_short_inverse = malloc(sizeof(plan_t)*ndim);
        p->plans_long_inverse = malloc(sizeof(plan_t)*ndim);
        #else
        return 3;
        #endif
        }

    /* local problem size */
    int size_in = 1;
    int size_out = 1;

    /* since we expect column-major input, the leading dimension
      has no embedding */
    p->inembed[0] = gdim[0]/pdim[0];
    p->oembed[0] = gdim[0]/pdim[0];

    for (i = 0; i < ndim ; ++i)
        {
        size_in *= p->inembed[i];
        size_out *= p->oembed[i];
        }

    p->size_in = size_in;
    p->size_out = size_out;

    /* find length k0 of last stage of butterflies */
    p->k0 = malloc(sizeof(int)*ndim);

    for (i = 0; i< ndim; ++i)
        {
        int length = gdim[i]/pdim[i];
        if (length > 1)
            {
            int c;
            for (c=gdim[i]; c>length; c /= length)
                ;
            p->k0[i] = c;
            }
        else
            {
            p->k0[i] = 1;
            }
        }

    p->rho_L = (int **)malloc(ndim*sizeof(int *));
    p->rho_pk0= (int **)malloc(ndim*sizeof(int *));
    p->rho_Lk0 = (int **)malloc(ndim*sizeof(int *));

    for (i = 0; i < ndim; ++i)
        {
        int length = gdim[i]/pdim[i];
        p->rho_L[i] = (int *) malloc(sizeof(int)*length);
        p->rho_pk0[i] = (int *) malloc(sizeof(int)*pdim[i]/(p->k0[i]));
        p->rho_Lk0[i] = (int *) malloc(sizeof(int)*length/(p->k0[i]));
        bitrev_init(length, p->rho_L[i]);
        bitrev_init(pdim[i]/(p->k0[i]),p->rho_pk0[i]);
        bitrev_init(length/(p->k0[i]),p->rho_Lk0[i]);
        }

    /* processor coordinates */
    for (i = 0; i < ndim; ++i)
        {
        p->pidx[i] = pidx[i];
        }

    /* init local FFT library */
    int res;
    if (!device)
        {
        #ifdef ENABLE_HOST
        res = dfft_init_local_fft();
        #else
        return 3;
        #endif
        }
    else
        {
        #ifdef ENABLE_CUDA
        res = dfft_cuda_init_local_fft();
        #else
        return 2;
        #endif
        }

    if (res) return 1;

    int size = size_in;

    p->dfft_multi = 0;

    p->device = device;

    if (device)
        {
        /* use multidimensional local transforms */
        dfft_create_execution_flow(p);

        /* allocate storage for variables */
        int dmax = p->max_depth + 2;
        p->rev_j1 = (int **) malloc(sizeof(int *)*dmax);
        p->rev_global = (int **) malloc(sizeof(int *)*dmax);
        p->rev_partial = (int **) malloc(sizeof(int *)*dmax);
        p->c0 = (int **) malloc(sizeof(int *)*dmax);
        p->c1 = (int **) malloc(sizeof(int *)*dmax);
        int d;
        for (d = 0; d < dmax; ++d)
            {
            p->rev_j1[d] = (int *) malloc(sizeof(int)*ndim);
            p->rev_global[d] = (int *) malloc(sizeof(int)*ndim);
            p->rev_partial[d] = (int *) malloc(sizeof(int)*ndim);
            p->c0[d] = (int *) malloc(sizeof(int)*ndim);
            p->c1[d] = (int *) malloc(sizeof(int)*ndim);
            }

        p->dfft_multi = 1;
        }
    else
        {
        for (i = 0; i < ndim; ++i)
            {
            /* plan for short-distance butterflies */
            int st = size/p->inembed[i]*(gdim[i]/pdim[i]);

            #ifdef ENABLE_HOST
            int howmany = 1;
            #ifdef FFT1D_SUPPORTS_THREADS
            howmany = st/(p->k0[i]);
            #endif
            dfft_create_1d_plan(&(p->plans_short_forward[i]),p->k0[i],
                howmany, st/(p->k0[i]), 1, st/(p->k0[i]), 1, 0);
            dfft_create_1d_plan(&(p->plans_short_inverse[i]),p->k0[i],
                howmany, st/(p->k0[i]), 1, st/(p->k0[i]), 1, 1);

            /* plan for long-distance butterflies */
            int length = gdim[i]/pdim[i];
            #ifdef FFT1D_SUPPORTS_THREADS
            howmany = st/length;
            #endif
            dfft_create_1d_plan(&(p->plans_long_forward[i]), length,
                howmany, st/length,1, st/length,1, 0);
            dfft_create_1d_plan(&(p->plans_long_inverse[i]), length,
                howmany, st/length,1, st/length,1, 1);
            #else
            return 3;
            #endif

            size /= p->inembed[i];
            size *= p->oembed[i];
            }
        }

    /* Allocate scratch space */
    int scratch_size = 1;
    for (i = 0; i < ndim; ++i)
        scratch_size *= ((p->inembed[i] > p->oembed[i]) ? p->inembed[i]  : p->oembed[i]);
    p->scratch_size = scratch_size;

    if (!device)
        {
        #ifdef ENABLE_HOST
        dfft_allocate_aligned_memory(&(p->scratch),sizeof(cpx_t)*scratch_size);
        dfft_allocate_aligned_memory(&(p->scratch_2),sizeof(cpx_t)*scratch_size);
        dfft_allocate_aligned_memory(&(p->scratch_3),sizeof(cpx_t)*scratch_size);
        #else
        return 3;
        #endif
        }
    else
        {
        #ifdef ENABLE_CUDA
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch),sizeof(cuda_cpx_t)*scratch_size);
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch_2),sizeof(cuda_cpx_t)*scratch_size);
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch_3),sizeof(cuda_cpx_t)*scratch_size);
        #else
        return 2;
        #endif
        }

    p->input_cyclic = input_cyclic;
    p->output_cyclic = output_cyclic;

    #ifdef ENABLE_CUDA
    #ifndef NDEBUG
    p->check_cuda_errors = 1;
    #else
    p->check_cuda_errors = 0;
    #endif
    #endif

    p->row_m = row_m;

    /* before plan creation is complete, an initialization run will
     * be performed */
    p->init = 1;

    return 0;
    }